

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::cmake(cmake *this,Role role)

{
  _Rb_tree_header *p_Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmFileTimeComparison *this_02;
  cmState *pcVar2;
  cmMessenger *this_03;
  cmVariableWatch *this_04;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Generators).
  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Generators).
  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Generators).
  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = &(this->GeneratorPlatform).field_2;
  (this->GeneratorPlatform)._M_dataplus._M_p = (pointer)local_38;
  (this->GeneratorPlatform)._M_string_length = 0;
  (this->GeneratorPlatform).field_2._M_local_buf[0] = '\0';
  local_40 = &(this->GeneratorToolset).field_2;
  (this->GeneratorToolset)._M_dataplus._M_p = (pointer)local_40;
  (this->GeneratorToolset)._M_string_length = 0;
  (this->GeneratorToolset).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = &(this->CMakeEditCommand).field_2;
  (this->CMakeEditCommand)._M_dataplus._M_p = (pointer)local_48;
  (this->CMakeEditCommand)._M_string_length = 0;
  (this->CMakeEditCommand).field_2._M_local_buf[0] = '\0';
  local_50 = &(this->CXXEnvironment).field_2;
  (this->CXXEnvironment)._M_dataplus._M_p = (pointer)local_50;
  (this->CXXEnvironment)._M_string_length = 0;
  (this->CXXEnvironment).field_2._M_local_buf[0] = '\0';
  local_58 = &(this->CCEnvironment).field_2;
  (this->CCEnvironment)._M_dataplus._M_p = (pointer)local_58;
  (this->CCEnvironment)._M_string_length = 0;
  (this->CCEnvironment).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->CheckBuildSystemArgument).field_2;
  (this->CheckBuildSystemArgument)._M_dataplus._M_p = (pointer)local_60;
  (this->CheckBuildSystemArgument)._M_string_length = 0;
  (this->CheckBuildSystemArgument).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->CheckStampFile).field_2;
  (this->CheckStampFile)._M_dataplus._M_p = (pointer)local_68;
  (this->CheckStampFile)._M_string_length = 0;
  (this->CheckStampFile).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->CheckStampList).field_2;
  (this->CheckStampList)._M_dataplus._M_p = (pointer)local_70;
  (this->CheckStampList)._M_string_length = 0;
  (this->CheckStampList).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->VSSolutionFile).field_2;
  (this->VSSolutionFile)._M_dataplus._M_p = (pointer)local_78;
  (this->VSSolutionFile)._M_string_length = 0;
  (this->VSSolutionFile).field_2._M_local_buf[0] = '\0';
  this_00 = &this->SourceFileExtensions;
  local_80 = &(this->GraphVizFile).field_2;
  (this->HeaderFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeaderFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SourceFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HeaderFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFileExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GraphVizFile)._M_dataplus._M_p = (pointer)local_80;
  (this->GraphVizFile)._M_string_length = 0;
  (this->GraphVizFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this_01 = &this->HeaderFileExtensions;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmStateSnapshot::cmStateSnapshot(&this->CurrentSnapshot,(cmState *)0x0);
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Trace = false;
  this->TraceExpand = false;
  this->WarnUninitialized = false;
  this->WarnUnused = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->DebugOutput = false;
  this->ClearBuildSystem = false;
  this->DebugTryCompile = false;
  this_02 = (cmFileTimeComparison *)operator_new(8);
  cmFileTimeComparison::cmFileTimeComparison(this_02);
  this->FileComparison = this_02;
  pcVar2 = (cmState *)operator_new(0x218);
  cmState::cmState(pcVar2);
  this->State = pcVar2;
  cmState::CreateBaseSnapshot((cmStateSnapshot *)local_a0,pcVar2);
  (this->CurrentSnapshot).Position.Position = local_a0._16_8_;
  (this->CurrentSnapshot).State = (cmState *)local_a0._0_8_;
  (this->CurrentSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_a0._8_8_;
  this_03 = (cmMessenger *)operator_new(8);
  cmMessenger::cmMessenger(this_03,this->State);
  this->Messenger = this_03;
  this->Debugger = (cmDebugger *)0x0;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  this->CurrentWorkingMode = NORMAL_MODE;
  this->ProgressCallback = (ProgressCallbackType)0x0;
  this->ProgressCallbackClientData = (void *)0x0;
  this_04 = (cmVariableWatch *)operator_new(0x30);
  cmVariableWatch::cmVariableWatch(this_04);
  this->VariableWatch = this_04;
  AddDefaultGenerators(this);
  AddDefaultExtraGenerators(this);
  if (role - RoleScript < 2) {
    GetScriptingCommands(this->State);
    if (role == RoleProject) {
      GetProjectCommands(this->State);
    }
  }
  cmSystemTools::EnableVSConsoleOutput();
  pcVar2 = (cmState *)(local_a0 + 0x10);
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"c","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"C","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"c++","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"cc","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"cpp","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"cxx","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"m","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"M","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"mm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"h","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"hh","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"h++","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"hm","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"hpp","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"hxx","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"in","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"txx","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((cmState *)local_a0._0_8_ != pcVar2) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  return;
}

Assistant:

cmake::cmake(Role role)
{
  this->Trace = false;
  this->TraceExpand = false;
  this->WarnUninitialized = false;
  this->WarnUnused = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->DebugOutput = false;
  this->DebugTryCompile = false;
  this->ClearBuildSystem = false;
  this->FileComparison = new cmFileTimeComparison;

  this->State = new cmState;
  this->CurrentSnapshot = this->State->CreateBaseSnapshot();
  this->Messenger = new cmMessenger(this->State);

#ifdef __APPLE__
  struct rlimit rlp;
  if (!getrlimit(RLIMIT_STACK, &rlp)) {
    if (rlp.rlim_cur != rlp.rlim_max) {
      rlp.rlim_cur = rlp.rlim_max;
      setrlimit(RLIMIT_STACK, &rlp);
    }
  }
#endif
  this->Debugger = CM_NULLPTR;
  this->GlobalGenerator = CM_NULLPTR;
  this->ProgressCallback = CM_NULLPTR;
  this->ProgressCallbackClientData = CM_NULLPTR;
  this->CurrentWorkingMode = NORMAL_MODE;

#ifdef CMAKE_BUILD_WITH_CMAKE
  this->VariableWatch = new cmVariableWatch;
#endif

  this->AddDefaultGenerators();
  this->AddDefaultExtraGenerators();
  if (role == RoleScript || role == RoleProject) {
    this->AddScriptingCommands();
  }
  if (role == RoleProject) {
    this->AddProjectCommands();
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();

  // Set up a list of source and header extensions
  // these are used to find files when the extension
  // is not given
  // The "c" extension MUST precede the "C" extension.
  this->SourceFileExtensions.push_back("c");
  this->SourceFileExtensions.push_back("C");

  this->SourceFileExtensions.push_back("c++");
  this->SourceFileExtensions.push_back("cc");
  this->SourceFileExtensions.push_back("cpp");
  this->SourceFileExtensions.push_back("cxx");
  this->SourceFileExtensions.push_back("m");
  this->SourceFileExtensions.push_back("M");
  this->SourceFileExtensions.push_back("mm");

  this->HeaderFileExtensions.push_back("h");
  this->HeaderFileExtensions.push_back("hh");
  this->HeaderFileExtensions.push_back("h++");
  this->HeaderFileExtensions.push_back("hm");
  this->HeaderFileExtensions.push_back("hpp");
  this->HeaderFileExtensions.push_back("hxx");
  this->HeaderFileExtensions.push_back("in");
  this->HeaderFileExtensions.push_back("txx");
}